

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O1

RABlock * __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
          (ZoneStack<asmjit::v1_14::RABlock_*> *this)

{
  int *piVar1;
  ZoneAllocator *pZVar2;
  byte bVar3;
  Error EVar4;
  uint uVar5;
  RABlock *extraout_RAX;
  undefined4 extraout_var;
  RABlock *pRVar6;
  uint uVar7;
  undefined8 *in_RCX;
  uint *puVar8;
  long *plVar9;
  uint *puVar10;
  uint uVar11;
  undefined4 extraout_EDX;
  undefined8 *extraout_RDX;
  uint *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ZoneVectorBase *unaff_RBX;
  uint uVar17;
  ulong unaff_RBP;
  ulong uVar18;
  ZoneAllocator *in_RSI;
  uint *puVar19;
  long *plVar20;
  ZoneAllocator *allocator;
  uint *puVar21;
  ZoneAllocator *this_00;
  ZoneAllocator *pZVar22;
  undefined2 uVar23;
  uint *in_R8;
  uint *puVar24;
  ulong uVar25;
  long *plVar26;
  ZoneAllocator *pZVar27;
  int iVar28;
  long *plVar29;
  ulong uVar30;
  long lVar31;
  uint *in_R11;
  char cVar32;
  long *plVar33;
  long *plVar34;
  ZoneVectorBase *this_01;
  bool bVar35;
  bool bVar36;
  char cVar37;
  ulong auStack_4d0 [2];
  ZoneVectorBase ZStack_4c0;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  uint *puStack_b8;
  ulong uStack_b0;
  size_t sStack_80;
  ZoneVectorBase *pZStack_78;
  undefined8 *puStack_60;
  code *pcStack_58;
  uint *puStack_50;
  code *pcStack_48;
  ZoneVectorBase *pZStack_40;
  
  if (*(long *)this == 0) {
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  }
  else {
    lVar13 = *(long *)&this->field_0x8;
    in_RCX = *(undefined8 **)(lVar13 + 0x10);
    if (in_RCX != *(undefined8 **)(*(long *)&this->field_0x10 + 0x18)) {
      if (in_RCX != *(undefined8 **)(lVar13 + 0x18)) {
        pRVar6 = (RABlock *)*in_RCX;
        *(undefined8 **)(lVar13 + 0x10) = in_RCX + 1;
        if (in_RCX + 1 == *(undefined8 **)(lVar13 + 0x18)) {
          ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
        }
        return pRVar6;
      }
      goto LAB_0012abd5;
    }
  }
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
LAB_0012abd5:
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  pRVar6 = *(RABlock **)&((ZoneVectorBase *)this)->_data;
  if (pRVar6 == (RABlock *)0x0) {
    return (RABlock *)0x0;
  }
  if (*(long *)in_RSI == 0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar11 = ((ZoneVectorBase *)this)->_capacity << 2;
    uVar30 = (ulong)uVar11;
    unaff_RBX = (ZoneVectorBase *)this;
    if (uVar30 != 0) {
      if (uVar11 < 0x201) {
        if (uVar11 < 0x81) {
          uVar7 = (uint)(uVar30 + 0x1fffffffff >> 5);
        }
        else {
          uVar7 = (int)(uVar30 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar7 = 0;
      }
      if (uVar11 < 0x201) {
        *(undefined8 *)pRVar6 = *(undefined8 *)(in_RSI + (ulong)uVar7 * 8 + 8);
        *(RABlock **)(in_RSI + (ulong)uVar7 * 8 + 8) = pRVar6;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar6,uVar30);
        pRVar6 = extraout_RAX;
      }
      *(undefined8 *)&((ZoneVectorBase *)this)->_data = 0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      return pRVar6;
    }
  }
  ZoneVector<unsigned_int>::release();
  if (in_RSI < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return (RABlock *)((long)in_RSI * 8 + *(long *)&((ZoneVectorBase *)this)->_data);
  }
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  pRVar6 = (RABlock *)0x0;
  pZStack_40 = unaff_RBX;
  if (((ZoneVectorBase *)this)->_capacity <
      (uint)(*(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1))) {
    pcStack_48 = (code *)0x12ade5;
    EVar4 = ZoneVectorBase::_growingReserve
                      ((ZoneVectorBase *)this,in_RSI,0xc,
                       *(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1));
    pRVar6 = (RABlock *)CONCAT44(extraout_var,EVar4);
  }
  if ((int)pRVar6 != 0) {
    return pRVar6;
  }
  puVar8 = (uint *)((ZoneVectorBase *)this)->_data;
  puVar24 = (uint *)*extraout_RDX;
  puVar12 = (uint *)*in_RCX;
  puVar10 = puVar24 + (ulong)*(uint *)(extraout_RDX + 1) * 3;
  puVar19 = puVar12 + (ulong)*(uint *)(in_RCX + 1) * 3;
  puVar21 = puVar8;
  if ((ulong)*(uint *)(in_RCX + 1) != 0 && (ulong)*(uint *)(extraout_RDX + 1) != 0) {
    uVar11 = *puVar24;
    do {
      while( true ) {
        uVar7 = puVar12[1];
        in_R11 = (uint *)(ulong)uVar7;
        if (uVar11 < uVar7) break;
        unaff_RBP = (ulong)*puVar12;
        *puVar21 = *puVar12;
        puVar21[1] = uVar7;
        in_R11 = (uint *)(ulong)*in_R8;
        puVar21[2] = *in_R8;
        puVar21 = puVar21 + 3;
        puVar12 = puVar12 + 3;
        if (puVar12 == puVar19) {
          bVar35 = true;
          goto LAB_0012ad68;
        }
      }
      uVar11 = *puVar12;
      while( true ) {
        uVar7 = puVar24[1];
        unaff_RBP = (ulong)uVar7;
        if (uVar11 < uVar7) break;
        in_R11 = puVar21 + 3;
        in_RCX = (undefined8 *)(ulong)*puVar24;
        *puVar21 = *puVar24;
        puVar21[1] = uVar7;
        unaff_RBP = (ulong)puVar24[2];
        puVar21[2] = puVar24[2];
        puVar24 = puVar24 + 3;
        puVar21 = in_R11;
        if (puVar24 == puVar10) {
          bVar35 = true;
          goto LAB_0012ad68;
        }
      }
      uVar11 = *puVar24;
    } while (puVar12[1] <= uVar11);
    pRVar6 = (RABlock *)0xffffffff;
    bVar35 = false;
LAB_0012ad68:
    if (!bVar35) {
      return pRVar6;
    }
  }
  for (; puVar24 != puVar10; puVar24 = puVar24 + 3) {
    *(undefined8 *)puVar21 = *(undefined8 *)puVar24;
    puVar21[2] = puVar24[2];
    puVar21 = puVar21 + 3;
  }
  for (; puVar12 != puVar19; puVar12 = puVar12 + 3) {
    *(undefined8 *)puVar21 = *(undefined8 *)puVar12;
    puVar21[2] = *in_R8;
    puVar21 = puVar21 + 3;
  }
  if ((puVar21 < puVar8) || (puVar8 + (ulong)((ZoneVectorBase *)this)->_capacity * 3 < puVar21)) {
    pcStack_48 = (code *)0x12adef;
    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
    uVar11 = (uint)puVar8;
  }
  else {
    puVar21 = (uint *)((ulong)((long)puVar21 - (long)puVar8) >> 2);
    uVar11 = (int)puVar21 * -0x55555555;
    if (uVar11 <= ((ZoneVectorBase *)this)->_capacity) {
      ((ZoneVectorBase *)this)->_size = uVar11;
      return (RABlock *)0x0;
    }
  }
  uVar23 = SUB82(puVar24,0);
  pcStack_48 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
  pcStack_48 = (code *)(ulong)puVar21[2];
  if (puVar19 < pcStack_48) {
    return (RABlock *)((long)puVar19 * 8 + *(long *)puVar21);
  }
  puStack_50 = (uint *)0x12ae0d;
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  puStack_50 = (uint *)(ulong)puVar21[2];
  if (puVar19 < puStack_50) {
    return (RABlock *)((long)puVar19 * 0xc + *(long *)puVar21);
  }
  pcStack_58 = RAStackAllocator::newSlot;
  ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
  pZStack_78 = (ZoneVectorBase *)this;
  puStack_60 = in_RCX;
  pcStack_58 = (code *)unaff_RBP;
  if ((puVar21[9] == puVar21[8]) &&
     (EVar4 = ZoneVectorBase::_grow((ZoneVectorBase *)(puVar21 + 6),*(ZoneAllocator **)puVar21,8,1),
     EVar4 != 0)) {
    return (RABlock *)0x0;
  }
  this_00 = *(ZoneAllocator **)puVar21;
  if (*(long *)this_00 == 0) {
    RAStackAllocator::newSlot();
  }
  else {
    pRVar6 = (RABlock *)ZoneAllocator::_alloc(this_00,0x14,&sStack_80);
    if (pRVar6 == (RABlock *)0x0) {
      return (RABlock *)0x0;
    }
    *pRVar6 = SUB81((ulong)puVar19 & 0xffffffff,0);
    pRVar6[1] = (RABlock)((char)uVar11 + (uVar11 == 0));
    *(undefined2 *)(pRVar6 + 2) = uVar23;
    *(undefined4 *)(pRVar6 + 8) = 0;
    *(undefined4 *)(pRVar6 + 4) = extraout_EDX;
    *(undefined8 *)(pRVar6 + 0xc) = 0;
    if (uVar11 < puVar21[4]) {
      uVar11 = puVar21[4];
    }
    puVar21[4] = uVar11;
    if (puVar21[8] < puVar21[9]) {
      *(RABlock **)(*(long *)(puVar21 + 6) + (ulong)puVar21[8] * 8) = pRVar6;
      puVar21[8] = puVar21[8] + 1;
      return pRVar6;
    }
  }
  RAStackAllocator::newSlot();
  uStack_b0 = (ulong)puVar19 & 0xffffffff;
  puStack_b8 = puVar21;
  plVar9 = *(long **)(this_00 + 0x18);
  uVar30 = (ulong)*(uint *)(this_00 + 0x20);
  if (uVar30 != 0) {
    plVar20 = (long *)0x0;
    do {
      lVar13 = *(long *)((long)plVar9 + (long)plVar20);
      bVar3 = *(byte *)(lVar13 + 1);
      if (bVar3 == 0) goto LAB_0012b353;
      uVar11 = 0;
      if (bVar3 != 0) {
        for (; (bVar3 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      uVar7 = 6;
      if ((char)uVar11 != '\a') {
        uVar7 = uVar11;
      }
      if ((*(byte *)(lVar13 + 2) & 1) == 0) {
        uVar25 = (ulong)(uVar7 & 0xff);
      }
      else {
        uVar25 = (ulong)(byte)((byte)uVar7 ^ 7) * (ulong)*(uint *)(lVar13 + 8) + 0x10;
      }
      if (0xfffffffe < uVar25) {
        uVar25 = 0xffffffff;
      }
      *(int *)(lVar13 + 0xc) = (int)uVar25;
      plVar20 = plVar20 + 1;
    } while (uVar30 * 8 - (long)plVar20 != 0);
  }
  plVar20 = plVar9 + uVar30;
  lVar13 = 0;
LAB_0012af74:
  uVar25 = (long)plVar20 - (long)plVar9 >> 3;
  if (7 < uVar25) {
    plVar34 = plVar9 + 1;
    plVar26 = plVar20 + -1;
    lVar14 = *(long *)((long)plVar9 + (uVar25 & 0xfffffffffffffffe) * 4);
    *(long *)((long)plVar9 + (uVar25 & 0xfffffffffffffffe) * 4) = *plVar9;
    *plVar9 = lVar14;
    lVar14 = plVar9[1];
    if (*(uint *)(plVar20[-1] + 0xc) < *(uint *)(lVar14 + 0xc)) {
      *plVar34 = plVar20[-1];
      *plVar26 = lVar14;
    }
    lVar14 = *plVar9;
    if (*(uint *)(*plVar26 + 0xc) < *(uint *)(lVar14 + 0xc)) {
      *plVar9 = *plVar26;
      *plVar26 = lVar14;
    }
    lVar14 = plVar9[1];
    if (*(uint *)(*plVar9 + 0xc) < *(uint *)(lVar14 + 0xc)) {
      plVar9[1] = *plVar9;
      *plVar9 = lVar14;
    }
LAB_0012aff6:
    if (plVar34 < plVar26) goto code_r0x0012affb;
    goto LAB_0012b010;
  }
  if ((plVar9 != plVar20) && (1 < (long)uVar25)) {
    plVar34 = plVar9 + 1;
    plVar26 = plVar34;
joined_r0x0012b098:
    do {
      if (plVar9 < plVar34) {
        lVar14 = plVar34[-1];
        uVar11 = *(uint *)(lVar14 + 0xc);
        in_R11 = (uint *)(ulong)uVar11;
        if (*(uint *)(*plVar34 + 0xc) < uVar11) {
          plVar34[-1] = *plVar34;
          *plVar34 = lVar14;
          plVar34 = plVar34 + -1;
          goto joined_r0x0012b098;
        }
      }
      plVar34 = plVar26 + 1;
      plVar26 = plVar34;
    } while (plVar34 < (long *)(((long)plVar20 - (long)plVar9) + (long)plVar9));
  }
  if (lVar13 != 0) {
    plVar9 = *(long **)((long)auStack_4d0 + lVar13);
    plVar20 = *(long **)((long)auStack_4d0 + lVar13 + 8);
    lVar13 = lVar13 + -0x10;
    goto LAB_0012af74;
  }
  uStack_470 = 0;
  uStack_468 = 0;
  uStack_480 = 0;
  uStack_478 = 0;
  uStack_490 = 0;
  uStack_488 = 0;
  uStack_4a0 = 0;
  uStack_498 = 0;
  uStack_4b0 = 0;
  uStack_4a8 = 0;
  ZStack_4c0._data = (void *)0x0;
  ZStack_4c0._size = 0;
  ZStack_4c0._capacity = 0;
  bVar35 = uVar30 == 0;
  if (bVar35) {
    iVar28 = -1;
  }
  else {
    pZVar27 = *(ZoneAllocator **)(this_00 + 0x18);
    pZVar2 = pZVar27 + uVar30 * 8;
    uVar30 = 0;
    do {
      lVar13 = *(long *)pZVar27;
      cVar32 = '\a';
      if ((*(byte *)(lVar13 + 2) & 2) == 0) {
        bVar3 = *(byte *)(lVar13 + 1);
        uVar11 = *(uint *)(lVar13 + 4);
        allocator = (ZoneAllocator *)(ulong)uVar11;
        iVar28 = 0;
        if (uVar11 < 0x40) {
          uVar7 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          puVar10 = (uint *)((long)&ZStack_4c0._size + (ulong)(uVar7 << 4));
          lVar14 = 0;
          if ((ulong)uVar7 < 6) {
            lVar14 = 5 - (ulong)uVar7;
          }
          lVar14 = lVar14 + 1;
          do {
            bVar36 = *puVar10 != 0;
            if (bVar36) {
              uVar7 = *puVar10 - 1;
              pZVar22 = (ZoneAllocator *)(ulong)uVar7;
              *puVar10 = uVar7;
              uVar7 = *(uint *)(*(long *)(puVar10 + -2) + (long)pZVar22 * 8);
              if (uVar7 % (uint)bVar3 != 0) goto LAB_0012b35d;
              iVar28 = *(int *)(*(long *)(puVar10 + -2) + 4 + (long)pZVar22 * 8);
              *(uint *)(lVar13 + 0x10) = uVar7;
              iVar28 = iVar28 - uVar11;
              uVar25 = (ulong)(uVar7 - uVar11);
              goto LAB_0012b1c7;
            }
            puVar10 = puVar10 + 4;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          uVar25 = 0;
        }
        else {
          bVar36 = false;
          uVar25 = 0;
        }
LAB_0012b1c7:
        auStack_4d0[1] = (ulong)bVar3;
        uVar7 = -(uint)bVar3 & ((int)uVar30 + (uint)bVar3) - 1;
        iVar15 = uVar7 - (int)uVar30;
        iVar16 = iVar15;
        if (iVar15 == 0 || bVar36) {
          iVar16 = iVar28;
        }
        uVar30 = uVar30 & 0xffffffff;
        if (!bVar36) {
          uVar30 = (ulong)uVar7;
        }
        if (iVar16 != 0) {
          uVar18 = (ulong)uVar7;
          if (iVar15 == 0 || bVar36) {
            uVar18 = uVar25;
          }
          uVar7 = iVar16 + (int)uVar18;
          do {
            uVar11 = (uint)allocator;
            uVar17 = (uint)uVar18;
            cVar32 = '\0';
            if (uVar7 <= uVar17) goto LAB_0012b2cf;
            iVar28 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
              }
            }
            uVar11 = 1 << ((byte)iVar28 & 0x1f);
            cVar37 = '\r';
            if (uVar11 <= uVar7 - uVar17) {
              uVar25 = (ulong)(uint)(iVar28 << 4);
              this_01 = (ZoneVectorBase *)((long)&ZStack_4c0._data + uVar25);
              if (*(int *)((long)&ZStack_4c0._size + uVar25) ==
                  *(int *)((long)&ZStack_4c0._capacity + uVar25)) {
                allocator = *(ZoneAllocator **)this_00;
                auStack_4d0[0] = uVar30;
                uVar5 = ZoneVectorBase::_grow(this_01,allocator,8,1);
                in_R11 = (uint *)((ulong)in_R11 & 0xffffffff);
                uVar30 = auStack_4d0[0];
                if (uVar5 == 0) goto LAB_0012b235;
              }
              else {
LAB_0012b235:
                allocator = (ZoneAllocator *)(uVar18 | (ulong)uVar11 << 0x20);
                *(ZoneAllocator **)
                 ((long)this_01->_data + (ulong)*(uint *)((long)&ZStack_4c0._size + uVar25) * 8) =
                     allocator;
                piVar1 = (int *)((long)&ZStack_4c0._size + uVar25);
                *piVar1 = *piVar1 + 1;
                uVar5 = 0;
              }
              cVar37 = uVar5 != 0;
              in_R11 = (uint *)((ulong)in_R11 & 0xffffffff);
              if ((bool)cVar37) {
                in_R11 = (uint *)(ulong)uVar5;
                uVar11 = 0;
              }
              uVar18 = (ulong)(uVar11 + uVar17);
            }
            uVar11 = (uint)allocator;
          } while (cVar37 == '\0');
          cVar32 = '\0';
          if (cVar37 != '\r') {
            cVar32 = cVar37;
          }
LAB_0012b2cf:
          if (cVar32 != '\0') goto LAB_0012b2f6;
        }
        cVar32 = '\0';
        if (!bVar36) {
          pZVar22 = pZVar2;
          if ((int)((uVar30 & 0xffffffff) % (auStack_4d0[1] & 0xffffffff)) != 0) goto LAB_0012b358;
          *(int *)(lVar13 + 0x10) = (int)uVar30;
          uVar30 = (ulong)(uint)((int)uVar30 + *(int *)(lVar13 + 4));
        }
      }
LAB_0012b2f6:
      if ((cVar32 != '\a') && (cVar32 != '\0')) break;
      pZVar27 = pZVar27 + 8;
      bVar35 = pZVar27 == pZVar2;
    } while (!bVar35);
    iVar28 = (int)uVar30 + -1;
  }
  if (bVar35) {
    *(int *)(this_00 + 0xc) = -*(int *)(this_00 + 0x10) & iVar28 + *(int *)(this_00 + 0x10);
    in_R11 = (uint *)0x0;
  }
  return (RABlock *)((ulong)in_R11 & 0xffffffff);
code_r0x0012affb:
  plVar33 = plVar34 + 1;
  plVar34 = plVar34 + 1;
  if (*(uint *)(*plVar33 + 0xc) < *(uint *)(*plVar9 + 0xc)) goto LAB_0012aff6;
LAB_0012b010:
  do {
    if (plVar26 <= plVar9) break;
    plVar33 = plVar26 + -1;
    plVar26 = plVar26 + -1;
  } while (*(uint *)(*plVar9 + 0xc) < *(uint *)(*plVar33 + 0xc));
  if (plVar34 <= plVar26) {
    lVar14 = *plVar34;
    *plVar34 = *plVar26;
    *plVar26 = lVar14;
    goto LAB_0012aff6;
  }
  lVar14 = *plVar9;
  lVar31 = (long)plVar26 - (long)plVar9;
  in_R11 = (uint *)((long)plVar20 - (long)plVar34);
  plVar33 = plVar34;
  if ((long)in_R11 < lVar31) {
    plVar33 = plVar9;
  }
  *plVar9 = *plVar26;
  plVar29 = plVar20;
  if ((long)in_R11 < lVar31) {
    plVar29 = plVar26;
  }
  *plVar26 = lVar14;
  *(long **)((long)&ZStack_4c0._data + lVar13) = plVar33;
  *(long **)((long)&ZStack_4c0._size + lVar13) = plVar29;
  if (lVar13 < 0x3f1) {
    if ((long)in_R11 < lVar31) {
      plVar9 = plVar34;
      plVar26 = plVar20;
    }
    plVar20 = plVar26;
    lVar13 = lVar13 + 0x10;
    goto LAB_0012af74;
  }
  RAStackAllocator::calculateStackFrame();
LAB_0012b353:
  uVar11 = (uint)plVar20;
  RAStackAllocator::calculateStackFrame();
  pZVar22 = this_00;
LAB_0012b358:
  RAStackAllocator::calculateStackFrame();
LAB_0012b35d:
  RAStackAllocator::calculateStackFrame();
  uVar7 = *(uint *)(pZVar22 + 0x20);
  if ((ulong)uVar7 != 0) {
    lVar13 = *(long *)(pZVar22 + 0x18);
    lVar14 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar13 + lVar14) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar13 + lVar14) + 0x10);
        *piVar1 = *piVar1 + uVar11;
      }
      lVar14 = lVar14 + 8;
    } while ((ulong)uVar7 << 3 != lVar14);
  }
  return (RABlock *)0x0;
}

Assistant:

inline T popFirst() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexFirst];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->start<T>();
    T item = *ptr++;

    block->setStart(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexFirst, kMidBlockIndex);

    return item;
  }